

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall density::lifo_buffer::~lifo_buffer(lifo_buffer *this)

{
  detail::ThreadLifoAllocator<0>::deallocate(this->m_data,this->m_size + 7 & 0xfffffffffffffff8);
  return;
}

Assistant:

~lifo_buffer()
        {
            detail::ThreadLifoAllocator<>::deallocate(m_data, uint_upper_align(m_size, alignment));
        }